

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image2D.cpp
# Opt level: O0

void __thiscall Image2D::Image2D(Image2D *this,string *name,string *type,int width,int height)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  bool bVar4;
  undefined4 in_ECX;
  string *in_RSI;
  string *in_RDI;
  undefined4 in_R8D;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = in_ECX;
  *(undefined4 *)(in_RDI + 0x24) = in_R8D;
  *(undefined4 *)(in_RDI + 0x28) = 3;
  std::ofstream::ofstream(in_RDI + 0x30);
  uVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffffb7,
                                   CONCAT16(in_stack_ffffffffffffffb6,
                                            CONCAT15(in_stack_ffffffffffffffb5,
                                                     CONCAT14(in_stack_ffffffffffffffb4,
                                                              in_stack_ffffffffffffffb0)))),
                          in_stack_ffffffffffffffa8);
  if ((bool)uVar1) {
    *(undefined4 *)(in_RDI + 0x230) = 0;
  }
  else {
    uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffffb6,
                                                    CONCAT15(in_stack_ffffffffffffffb5,
                                                             CONCAT14(in_stack_ffffffffffffffb4,
                                                                      in_stack_ffffffffffffffb0)))),
                            in_stack_ffffffffffffffa8);
    if ((bool)uVar2) {
      *(undefined4 *)(in_RDI + 0x230) = 1;
    }
    else {
      uVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffffb5,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0)))),
                              in_stack_ffffffffffffffa8);
      if ((bool)uVar3) {
        *(undefined4 *)(in_RDI + 0x230) = 2;
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(
                                                  in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0)))),
                                in_stack_ffffffffffffffa8);
        if (bVar4) {
          *(undefined4 *)(in_RDI + 0x230) = 3;
        }
        else {
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(bVar4,
                                                  in_stack_ffffffffffffffb0)))),
                                  in_stack_ffffffffffffffa8);
          if (bVar4) {
            *(undefined4 *)(in_RDI + 0x230) = 4;
          }
        }
      }
    }
  }
  return;
}

Assistant:

Image2D::Image2D(const std::string &name, const std::string &type, int width, int height)
: m_name(name),
  m_width(width),
  m_height(height),
  m_components(3)
{
	if (type == "PPM") {
		m_type = FileType::PPM;
	}
	else if (type == "PNG") {
		m_type = FileType::PNG;
	}
	else if (type == "BMP") {
		m_type = FileType::BMP;
	}
	else if (type == "TGA") {
		m_type = FileType::TGA;
	}
	else if (type == "HDR") {
		m_type = FileType::HDR;
	}
}